

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QAbstractEventDispatcher::TimerInfoV2>::
emplace<QAbstractEventDispatcher::TimerInfoV2>
          (QPodArrayOps<QAbstractEventDispatcher::TimerInfoV2> *this,qsizetype i,TimerInfoV2 *args)

{
  long lVar1;
  rep rVar2;
  rep rVar3;
  bool bVar4;
  qsizetype qVar5;
  TimerInfoV2 *pTVar6;
  rep *in_RDX;
  long in_RSI;
  QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2> *in_RDI;
  long in_FS_OFFSET;
  TimerInfoV2 *where;
  GrowthPosition pos;
  bool detach;
  TimerInfoV2 tmp;
  QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 uVar8;
  QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar4 = QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2>::needsDetach
                    (in_stack_ffffffffffffffc0);
  uVar8 = CONCAT13(bVar4,(int3)in_stack_ffffffffffffffcc);
  if (!bVar4) {
    if ((in_RSI == in_RDI->size) &&
       (qVar5 = QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2>::freeSpaceAtEnd
                          ((QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2> *)
                           CONCAT44(uVar8,in_stack_ffffffffffffffc8)), qVar5 != 0)) {
      pTVar6 = QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2>::end
                         (in_stack_ffffffffffffffc0);
      (pTVar6->interval).__r = *in_RDX;
      rVar2 = in_RDX[1];
      pTVar6->timerId = (int)rVar2;
      pTVar6->timerType = (int)((ulong)rVar2 >> 0x20);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0033103d;
    }
    if ((in_RSI == 0) &&
       (qVar5 = QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2>::freeSpaceAtBegin
                          ((QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2> *)
                           CONCAT44(uVar8,in_stack_ffffffffffffffc8)), qVar5 != 0)) {
      pTVar6 = QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2>::begin
                         ((QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2> *)0x330f66);
      pTVar6[-1].interval.__r = *in_RDX;
      rVar2 = in_RDX[1];
      pTVar6[-1].timerId = (int)rVar2;
      pTVar6[-1].timerType = (int)((ulong)rVar2 >> 0x20);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0033103d;
    }
  }
  rVar2 = *in_RDX;
  rVar3 = in_RDX[1];
  uVar7 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar7 = 1;
  }
  QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2>::detachAndGrow
            (this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
             (TimerInfoV2 **)CONCAT44(uVar8,uVar7),in_stack_ffffffffffffffc0);
  pTVar6 = createHole((QPodArrayOps<QAbstractEventDispatcher::TimerInfoV2> *)this_00,
                      (GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
                      CONCAT44(uVar8,uVar7));
  (pTVar6->interval).__r = rVar2;
  pTVar6->timerId = (int)rVar3;
  pTVar6->timerType = (int)((ulong)rVar3 >> 0x20);
LAB_0033103d:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }